

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DOMNodeImpl::isEqualNode(DOMNodeImpl *this,DOMNode *arg)

{
  short sVar1;
  short sVar2;
  DOMNode *pDVar3;
  int iVar4;
  int iVar5;
  short *psVar6;
  short *psVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  bool bVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (arg == (DOMNode *)0x0) {
    return false;
  }
  pDVar3 = this->fContainingNode;
  if (pDVar3 == arg) {
    return true;
  }
  iVar4 = (*arg->_vptr_DOMNode[4])(arg);
  iVar5 = (*pDVar3->_vptr_DOMNode[4])(pDVar3);
  if (iVar4 != iVar5) {
    return false;
  }
  iVar4 = (*pDVar3->_vptr_DOMNode[2])(pDVar3);
  psVar6 = (short *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*arg->_vptr_DOMNode[2])(arg);
  psVar7 = (short *)CONCAT44(extraout_var_00,iVar4);
  if (psVar6 != psVar7) {
    if (psVar7 == (short *)0x0 || psVar6 == (short *)0x0) {
      if (psVar6 == (short *)0x0) {
        if (psVar7 == (short *)0x0) goto LAB_0027a4f1;
        goto LAB_0027a4e2;
      }
      bVar8 = *psVar6 == 0;
      if ((psVar7 != (short *)0x0) && (*psVar6 == 0)) goto LAB_0027a4e2;
    }
    else {
      while (sVar1 = *psVar6, sVar1 != 0) {
        psVar6 = psVar6 + 1;
        sVar2 = *psVar7;
        psVar7 = psVar7 + 1;
        if (sVar1 != sVar2) {
          return false;
        }
      }
LAB_0027a4e2:
      bVar8 = *psVar7 == 0;
    }
    if (!bVar8) {
      return false;
    }
  }
LAB_0027a4f1:
  iVar4 = (*pDVar3->_vptr_DOMNode[0x18])(pDVar3);
  psVar6 = (short *)CONCAT44(extraout_var_01,iVar4);
  iVar4 = (*arg->_vptr_DOMNode[0x18])(arg);
  psVar7 = (short *)CONCAT44(extraout_var_02,iVar4);
  if (psVar6 != psVar7) {
    if (psVar7 == (short *)0x0 || psVar6 == (short *)0x0) {
      if (psVar6 == (short *)0x0) {
        if (psVar7 == (short *)0x0) goto LAB_0027a570;
        goto LAB_0027a561;
      }
      bVar8 = *psVar6 == 0;
      if ((psVar7 != (short *)0x0) && (*psVar6 == 0)) goto LAB_0027a561;
    }
    else {
      while (sVar1 = *psVar6, sVar1 != 0) {
        psVar6 = psVar6 + 1;
        sVar2 = *psVar7;
        psVar7 = psVar7 + 1;
        if (sVar1 != sVar2) {
          return false;
        }
      }
LAB_0027a561:
      bVar8 = *psVar7 == 0;
    }
    if (!bVar8) {
      return false;
    }
  }
LAB_0027a570:
  iVar4 = (*pDVar3->_vptr_DOMNode[0x16])(pDVar3);
  psVar6 = (short *)CONCAT44(extraout_var_03,iVar4);
  iVar4 = (*arg->_vptr_DOMNode[0x16])(arg);
  psVar7 = (short *)CONCAT44(extraout_var_04,iVar4);
  if (psVar6 == psVar7) goto LAB_0027a5e8;
  if (psVar7 == (short *)0x0 || psVar6 == (short *)0x0) {
    if (psVar6 == (short *)0x0) {
      if (psVar7 == (short *)0x0) goto LAB_0027a5e8;
      goto LAB_0027a5dd;
    }
    bVar8 = *psVar6 == 0;
    if ((psVar7 != (short *)0x0) && (*psVar6 == 0)) goto LAB_0027a5dd;
  }
  else {
    while (sVar1 = *psVar6, sVar1 != 0) {
      psVar6 = psVar6 + 1;
      sVar2 = *psVar7;
      psVar7 = psVar7 + 1;
      if (sVar1 != sVar2) {
        return false;
      }
    }
LAB_0027a5dd:
    bVar8 = *psVar7 == 0;
  }
  if (!bVar8) {
    return false;
  }
LAB_0027a5e8:
  iVar4 = (*pDVar3->_vptr_DOMNode[0x17])(pDVar3);
  iVar5 = (*arg->_vptr_DOMNode[0x17])(arg);
  bVar8 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_05,iVar4),
                            (XMLCh *)CONCAT44(extraout_var_06,iVar5));
  if (!bVar8) {
    return false;
  }
  iVar4 = (*pDVar3->_vptr_DOMNode[3])(pDVar3);
  iVar5 = (*arg->_vptr_DOMNode[3])(arg);
  bVar8 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_07,iVar4),
                            (XMLCh *)CONCAT44(extraout_var_08,iVar5));
  return bVar8;
}

Assistant:

bool DOMNodeImpl::isEqualNode(const DOMNode* arg) const
{
    if (!arg)
        return false;

    if (isSameNode(arg)) {
        return true;
    }

    const DOMNode* thisNode = getContainingNode();

    if (arg->getNodeType() != thisNode->getNodeType()) {
        return false;
    }

    // the compareString will check null string as well
    if (!XMLString::equals(thisNode->getNodeName(), arg->getNodeName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getLocalName(),arg->getLocalName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNamespaceURI(), arg->getNamespaceURI())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getPrefix(), arg->getPrefix())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNodeValue(), arg->getNodeValue())) {
        return false;
    }

    return true;
}